

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  LodePNGColorType LVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  size_t sVar7;
  undefined7 uVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  size_t sVar12;
  bool bVar13;
  byte bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  ColorTree tree;
  unsigned_short local_10a;
  unsigned_short local_108;
  unsigned_short local_106;
  unsigned_short local_104;
  byte local_101;
  byte local_100;
  byte local_ff;
  byte local_fe;
  byte local_fd;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uchar *local_f0;
  LodePNGColorMode *local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  size_t local_c8;
  size_t local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  int local_38;
  
  LVar1 = mode->colortype;
  bVar13 = (LVar1 & ~LCT_GREY_ALPHA) == LCT_GREY;
  local_f0 = in;
  uVar2 = lodepng_can_have_alpha(mode);
  iVar3 = 0;
  if ((ulong)LVar1 < 7) {
    iVar3 = *(int *)(&DAT_00239620 + (ulong)LVar1 * 4);
  }
  uVar5 = (ulong)(h * w);
  uVar10 = iVar3 * mode->bitdepth;
  bVar14 = uVar10 == 1;
  local_f8 = 2;
  if (8 < uVar10) {
    local_f8 = 0x101;
  }
  if ((8 >= uVar10 && !(bool)bVar14) && (local_f8 = 4, uVar10 != 2)) {
    local_f8 = 0x100;
    if (uVar10 == 4) {
      local_f8 = 0x10;
    }
  }
  uVar2 = uVar2 ^ 1;
  local_48 = (undefined1  [16])0x0;
  local_58 = (undefined1  [16])0x0;
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_b8 = (undefined1  [16])0x0;
  local_38 = -1;
  local_e8 = mode;
  if ((mode->bitdepth == 0x10) && (local_101 = bVar14, uVar5 != 0)) {
    sVar12 = 0;
    do {
      getPixelColorRGBA16(&local_106,&local_108,&local_10a,&local_104,local_f0,sVar12,local_e8);
      if (((((local_106 & 0xff) != local_106 >> 8) || ((local_108 & 0xff) != local_108 >> 8)) ||
          ((local_10a & 0xff) != local_10a >> 8)) || ((local_104 & 0xff) != local_104 >> 8)) {
        local_106 = 0;
        local_108 = 0;
        local_10a = 0;
        local_104 = 0;
        profile->bits = 0x10;
        sVar12 = 0;
        goto LAB_001a9e8e;
      }
      sVar12 = sVar12 + 1;
      bVar14 = local_101;
    } while (uVar5 != sVar12);
  }
  if (uVar5 != 0) {
    local_c8 = uVar5 - 1;
    sVar12 = 0;
    uVar6 = 0;
    local_cc = uVar10;
    do {
      uVar10 = local_cc;
      local_106 = local_106 & 0xff00;
      local_108 = local_108 & 0xff00;
      local_10a = local_10a & 0xff00;
      local_104 = local_104 & 0xff00;
      sVar7 = sVar12;
      local_fc = uVar6;
      getPixelColorRGBA8((uchar *)&local_106,(uchar *)&local_108,(uchar *)&local_10a,
                         (uchar *)&local_104,local_f0,sVar12,local_e8);
      if (((bVar14 & 1) == 0) && (profile->bits < 8)) {
        uVar6 = 1;
        if (1 < (byte)((byte)local_106 + 1)) {
          uVar6 = 8;
          if ((uint)(byte)local_106 * -0xf0f0f0f < 0xf0f0f10) {
            uVar6 = (uint)(0x3030303 < (uint)(byte)local_106 * -0x3030303) * 2 + 2;
          }
        }
        if (profile->bits < uVar6) {
          profile->bits = uVar6;
        }
      }
      uVar9 = profile->bits;
      local_101 = uVar10 <= uVar9;
      uVar5 = CONCAT71((int7)(sVar7 >> 8),1);
      bVar15 = !bVar13;
      bVar14 = (byte)local_10a;
      bVar13 = true;
      if (bVar15) {
        if ((byte)local_106 == (byte)local_108) {
          uVar5 = 0;
          bVar13 = false;
          if ((byte)local_106 == (byte)local_10a) goto LAB_001a9bcb;
        }
        profile->colored = 1;
        uVar8 = (undefined7)(uVar5 >> 8);
        uVar5 = CONCAT71(uVar8,1);
        bVar13 = true;
        if (uVar9 < 8) {
          profile->bits = 8;
          uVar5 = CONCAT71(uVar8,1);
        }
      }
LAB_001a9bcb:
      bVar4 = (byte)local_104;
      if (uVar2 == 0) {
        if ((profile->key_r == (local_106 & 0xff)) && (profile->key_g == (local_108 & 0xff))) {
          bVar15 = profile->key_b == (local_10a & 0xff);
        }
        else {
          bVar15 = false;
        }
        if ((byte)local_104 == 0xff) {
          bVar11 = 0;
          uVar2 = 0;
          if ((bool)(profile->key != 0 & bVar15)) {
            profile->alpha = 1;
            uVar2 = profile->bits;
            goto joined_r0x001a9db5;
          }
        }
        else {
          if (((byte)local_104 != 0) || (!(bool)(profile->key == 0 | bVar15))) {
            profile->alpha = 1;
            uVar2 = profile->bits;
joined_r0x001a9db5:
            if (uVar2 < 8) {
              profile->bits = 8;
            }
            goto LAB_001a9bdc;
          }
          uVar2 = 0;
          if ((profile->alpha == 0) && (profile->key == 0)) {
            profile->key = 1;
            profile->key_r = local_106 & 0xff;
            profile->key_g = local_108 & 0xff;
            profile->key_b = local_10a & 0xff;
            bVar11 = 0;
          }
          else {
            bVar11 = 0;
          }
        }
      }
      else {
LAB_001a9bdc:
        bVar11 = 1;
        uVar2 = 1;
      }
      uVar6 = 1;
      local_c0 = sVar12;
      if (local_fc == 0) {
        local_fe = (byte)local_106;
        local_fd = (byte)local_108;
        local_d0 = (uint)(byte)local_106;
        local_d4 = (uint)(byte)local_108;
        local_d8 = (uint)(byte)local_10a;
        local_dc = (uint)(byte)local_104;
        local_f4 = (uint)uVar5;
        local_fc = uVar9;
        iVar3 = color_tree_get((ColorTree *)local_b8,(byte)local_106,(byte)local_108,(byte)local_10a
                               ,(byte)local_104);
        uVar5 = (ulong)local_f4;
        uVar6 = 0;
        uVar9 = local_fc;
        if (iVar3 < 0) {
          local_100 = bVar4;
          local_ff = bVar14;
          color_tree_add((ColorTree *)local_b8,(uchar)local_d0,(uchar)local_d4,(uchar)local_d8,
                         (uchar)local_dc,profile->numcolors);
          uVar10 = profile->numcolors;
          if ((ulong)uVar10 < 0x100) {
            uVar5 = (ulong)(uVar10 * 4);
            profile->palette[(ulong)uVar10 * 4] = local_fe;
            profile->palette[uVar5 + 1] = local_fd;
            profile->palette[uVar5 + 2] = local_ff;
            profile->palette[uVar5 + 3] = local_100;
          }
          profile->numcolors = uVar10 + 1;
          uVar6 = (uint)(local_f8 <= uVar10 + 1);
          uVar5 = (ulong)local_f4;
          uVar9 = local_fc;
        }
      }
    } while ((((byte)uVar5 & bVar11 & (byte)uVar6 & local_cc <= uVar9) == 0) &&
            (sVar12 = local_c0 + 1, bVar14 = local_101, local_c8 != local_c0));
  }
  uVar2._0_2_ = profile->key_r;
  uVar2._2_2_ = profile->key_g;
  auVar16 = psllw(ZEXT416(uVar2),8);
  profile->key_r = auVar16._0_2_ + (undefined2)uVar2;
  profile->key_g = auVar16._2_2_ + uVar2._2_2_;
  profile->key_b = (short)(*(int *)&profile->key_b << 8) + (short)*(int *)&profile->key_b;
LAB_001a9e38:
  color_tree_cleanup((ColorTree *)local_b8);
  return 0;
  while ((!(bool)(bVar14 & bVar4) && (bVar15 = uVar5 - 1 != sVar12, sVar12 = sVar12 + 1, bVar15))) {
LAB_001a9e8e:
    getPixelColorRGBA16(&local_106,&local_108,&local_10a,&local_104,local_f0,sVar12,local_e8);
    bVar14 = 1;
    bVar15 = !bVar13;
    bVar13 = true;
    if (bVar15) {
      if (local_106 == local_108) {
        bVar14 = 0;
        bVar13 = false;
        if (local_106 == local_10a) goto LAB_001a9eeb;
      }
      profile->colored = 1;
      bVar14 = 1;
      bVar13 = true;
    }
LAB_001a9eeb:
    if (uVar2 == 0) {
      if ((local_106 == profile->key_r) && (local_108 == profile->key_g)) {
        bVar15 = local_10a == profile->key_b;
      }
      else {
        bVar15 = false;
      }
      if (local_104 == 0xffff) {
        bVar4 = 0;
        uVar2 = 0;
        if ((bool)(profile->key != 0 & bVar15)) {
          profile->alpha = 1;
          goto LAB_001a9fae;
        }
      }
      else {
        if ((local_104 != 0) || (!(bool)(profile->key == 0 | bVar15))) {
          profile->alpha = 1;
          if (profile->bits < 8) {
            profile->bits = 8;
          }
          goto LAB_001a9fae;
        }
        uVar2 = 0;
        if ((profile->alpha == 0) && (profile->key == 0)) {
          profile->key = 1;
          profile->key_r = local_106;
          profile->key_g = local_108;
          profile->key_b = local_10a;
          bVar4 = 0;
        }
        else {
          bVar4 = 0;
        }
      }
    }
    else {
LAB_001a9fae:
      bVar4 = 1;
      uVar2 = 1;
    }
  }
  goto LAB_001a9e38;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }
  }
  else /* < 16-bit */
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}